

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3ScaleAnimationBlock(Parser *this,Animation *anim)

{
  bool bVar1;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *this_00;
  reference pvVar2;
  aiVectorKey *key;
  byte local_21;
  uint local_20;
  int iStack_1c;
  bool b;
  uint iIndex;
  int iDepth;
  Animation *anim_local;
  Parser *this_local;
  
  iStack_1c = 0;
  _iIndex = anim;
  anim_local = (Animation *)this;
  do {
    if (*this->filePtr == '*') {
      this->filePtr = this->filePtr + 1;
      local_21 = 0;
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_SAMPLE",0x14);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mScalingType = TRACK;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_BEZIER_SCALE_KEY",0x18);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mScalingType = BEZIER;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_TCB_SCALE_KEY",0x15);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mScalingType = TCB;
      }
      if ((local_21 & 1) != 0) {
        this_00 = &_iIndex->akeyScaling;
        aiVectorKey::aiVectorKey((aiVectorKey *)&key);
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (this_00,(aiVectorKey *)&key);
        pvVar2 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::back(&_iIndex->akeyScaling)
        ;
        ParseLV4MeshFloatTriple(this,&(pvVar2->mValue).x,&local_20);
        pvVar2->mTime = (double)local_20;
      }
    }
    if (*this->filePtr == '{') {
      iStack_1c = iStack_1c + 1;
    }
    else if (*this->filePtr == '}') {
      iStack_1c = iStack_1c + -1;
      if (iStack_1c == 0) {
        this->filePtr = this->filePtr + 1;
        SkipToNextToken(this);
        return;
      }
    }
    else if (*this->filePtr == '\0') {
      LogError(this,"Encountered unexpected EOL while parsing a *CONTROL_POS_TRACK chunk (Level 3)")
      ;
    }
    bVar1 = IsLineEnd<char>(*this->filePtr);
    if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = this->filePtr + 1;
  } while( true );
}

Assistant:

void Parser::ParseLV3ScaleAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;

    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the three floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_SCALE_SAMPLE" ,20))
            {
                b = true;
                anim.mScalingType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_SCALE_KEY" ,24))
            {
                b = true;
                anim.mScalingType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_SCALE_KEY" ,21))
            {
                b = true;
                anim.mScalingType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyScaling.push_back(aiVectorKey());
                aiVectorKey& key = anim.akeyScaling.back();
                ParseLV4MeshFloatTriple(&key.mValue.x,iIndex);
                key.mTime = (double)iIndex;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_POS_TRACK");
    }
}